

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.c
# Opt level: O0

long oggpack_read(oggpack_buffer *b,int bits)

{
  uint uVar1;
  uint uVar2;
  unsigned_long m;
  long ret;
  int bits_local;
  oggpack_buffer *b_local;
  
  if ((bits < 0) || (0x20 < bits)) {
LAB_002d4699:
    b->ptr = (uchar *)0x0;
    b->endbyte = b->storage;
    b->endbit = 1;
    b_local = (oggpack_buffer *)0xffffffffffffffff;
  }
  else {
    uVar1 = b->endbit + bits;
    if (b->storage + -4 <= b->endbyte) {
      if (b->storage - (long)((int)(uVar1 + 7) >> 3) < b->endbyte) goto LAB_002d4699;
      if (uVar1 == 0) {
        return 0;
      }
    }
    uVar2 = (int)(uint)*b->ptr >> ((byte)b->endbit & 0x1f);
    m = (unsigned_long)(int)uVar2;
    if (8 < (int)uVar1) {
      uVar2 = (uint)b->ptr[1] << (8U - (char)b->endbit & 0x1f) | uVar2;
      m = (unsigned_long)(int)uVar2;
      if (0x10 < (int)uVar1) {
        uVar2 = (uint)b->ptr[2] << (0x10U - (char)b->endbit & 0x1f) | uVar2;
        m = (unsigned_long)(int)uVar2;
        if (0x18 < (int)uVar1) {
          uVar2 = (uint)b->ptr[3] << (0x18U - (char)b->endbit & 0x1f) | uVar2;
          m = (unsigned_long)(int)uVar2;
          if ((0x20 < (int)uVar1) && (b->endbit != 0)) {
            m = (unsigned_long)(int)((uint)b->ptr[4] << (0x20U - (char)b->endbit & 0x1f) | uVar2);
          }
        }
      }
    }
    b_local = (oggpack_buffer *)(mask[bits] & m);
    b->ptr = b->ptr + (int)uVar1 / 8;
    b->endbyte = (long)((int)uVar1 / 8) + b->endbyte;
    b->endbit = uVar1 & 7;
  }
  return (long)b_local;
}

Assistant:

long oggpack_read(oggpack_buffer *b,int bits){
  long ret;
  unsigned long m;

  if(bits<0 || bits>32) goto err;
  m=mask[bits];
  bits+=b->endbit;

  if(b->endbyte >= b->storage-4){
    /* not the main path */
    if(b->endbyte > b->storage-((bits+7)>>3)) goto overflow;
    /* special case to avoid reading b->ptr[0], which might be past the end of
        the buffer; also skips some useless accounting */
    else if(!bits)return(0L);
  }

  ret=b->ptr[0]>>b->endbit;
  if(bits>8){
    ret|=b->ptr[1]<<(8-b->endbit);
    if(bits>16){
      ret|=b->ptr[2]<<(16-b->endbit);
      if(bits>24){
        ret|=b->ptr[3]<<(24-b->endbit);
        if(bits>32 && b->endbit){
          ret|=b->ptr[4]<<(32-b->endbit);
        }
      }
    }
  }
  ret&=m;
  b->ptr+=bits/8;
  b->endbyte+=bits/8;
  b->endbit=bits&7;
  return ret;

 overflow:
 err:
  b->ptr=NULL;
  b->endbyte=b->storage;
  b->endbit=1;
  return -1L;
}